

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

RegExp * __thiscall re2c::mkAlt(re2c *this,RegExp *e1,RegExp *e2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  re2c *prVar5;
  Range *pRVar6;
  RegExp *pRVar7;
  RegExp *e2_00;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pair<std::_Rb_tree_iterator<re2c::RegExp_*>,_bool> pVar11;
  re2c *local_30;
  long lVar4;
  
  if (this == (re2c *)0x0) {
    lVar8 = 0;
LAB_00132d31:
    if (lVar8 != 0) {
      this = (re2c *)0x0;
    }
  }
  else {
    auVar9 = __dynamic_cast(this,&RegExp::typeinfo,&AltOp::typeinfo,0);
    e2 = auVar9._8_8_;
    lVar4 = auVar9._0_8_;
    if (lVar4 == 0) {
      auVar9 = __dynamic_cast(this,&RegExp::typeinfo,&MatchOp::typeinfo,0);
      e2 = auVar9._8_8_;
      lVar8 = auVar9._0_8_;
      goto LAB_00132d31;
    }
    if (*(long *)(lVar4 + 8) == 0) {
      lVar8 = 0;
    }
    else {
      auVar9 = __dynamic_cast(*(long *)(lVar4 + 8),&RegExp::typeinfo,&MatchOp::typeinfo,0);
      e2 = auVar9._8_8_;
      lVar8 = 0;
      if (auVar9._0_8_ != 0) {
        this = *(re2c **)(lVar4 + 0x10);
        lVar8 = auVar9._0_8_;
      }
    }
  }
  if (e1 == (RegExp *)0x0) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = e2;
    auVar9 = auVar9 << 0x40;
  }
  else {
    auVar9 = __dynamic_cast(e1,&RegExp::typeinfo,&AltOp::typeinfo,0);
    lVar4 = auVar9._0_8_;
    if (lVar4 != 0) {
      if (*(long *)(lVar4 + 8) == 0) {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = auVar9._8_8_;
        auVar9 = auVar10 << 0x40;
      }
      else {
        auVar10 = __dynamic_cast(*(long *)(lVar4 + 8),&RegExp::typeinfo,&MatchOp::typeinfo,0);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = auVar10._8_8_;
        auVar9 = auVar3 << 0x40;
        if (auVar10._0_8_ != 0) {
          e1 = *(RegExp **)(lVar4 + 0x10);
          auVar9 = auVar10;
        }
      }
      goto LAB_00132dbc;
    }
    auVar9 = __dynamic_cast(e1,&RegExp::typeinfo,&MatchOp::typeinfo,0);
  }
  if (auVar9._0_8_ != 0) {
    e1 = (RegExp *)0x0;
  }
LAB_00132dbc:
  auVar2._8_8_ = auVar9._8_8_;
  auVar2._0_8_ = lVar8;
  auVar1 = auVar9;
  if ((lVar8 != 0) && (auVar1 = auVar2, auVar9._0_8_ != 0)) {
    prVar5 = (re2c *)operator_new(0x10);
    pRVar6 = Range::add(*(Range **)(lVar8 + 8),*(Range **)(auVar9._0_8_ + 8));
    *(undefined ***)prVar5 = &PTR__RegExp_0015bd10;
    local_30 = prVar5;
    pVar11 = std::
             _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
             ::_M_insert_unique<re2c::RegExp*>
                       ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                         *)RegExp::vFreeList,(RegExp **)&local_30);
    auVar1._8_8_ = pVar11._8_8_;
    auVar1._0_8_ = prVar5;
    *(undefined ***)prVar5 = &PTR__RegExp_0015bbf0;
    *(Range **)(prVar5 + 8) = pRVar6;
  }
  pRVar7 = doAlt(this,e1,auVar1._8_8_);
  pRVar7 = doAlt(auVar1._0_8_,pRVar7,e2_00);
  return pRVar7;
}

Assistant:

RegExp * mkAlt (RegExp * e1, RegExp * e2)
{
	AltOp * a;
	MatchOp * m1;
	MatchOp * m2;

	a = dynamic_cast<AltOp*> (e1);
	if (a != NULL)
	{
		m1 = dynamic_cast<MatchOp*> (a->exp1);
		if (m1 != NULL)
		{
			e1 = a->exp2;
		}
	}
	else
	{
		m1 = dynamic_cast<MatchOp*> (e1);
		if (m1 != NULL)
		{
			e1 = NULL;
		}
	}
	a = dynamic_cast<AltOp*> (e2);
	if (a != NULL)
	{
		m2 = dynamic_cast<MatchOp*> (a->exp1);
		if (m2 != NULL)
		{
			e2 = a->exp2;
		}
	}
	else
	{
		m2 = dynamic_cast<MatchOp*> (e2);
		if (m2 != NULL)
		{
			e2 = NULL;
		}
	}

	return doAlt (merge (m1, m2), doAlt (e1, e2));
}